

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O3

void __thiscall Assimp::Ogre::OgreBinarySerializer::ReadMesh(OgreBinarySerializer *this,Mesh *mesh)

{
  uchar uVar1;
  unsigned_short uVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  Logger *pLVar6;
  VertexData *dest;
  StreamReader<false,_false> *this_00;
  long *local_1d0;
  long local_1c0 [2];
  char *local_1b0;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_1a8 [112];
  ios_base local_138 [264];
  
  uVar1 = StreamReader<false,_false>::Get<unsigned_char>(this->m_reader);
  mesh->hasSkeletalAnimations = uVar1 != '\0';
  pLVar6 = DefaultLogger::get();
  Logger::debug(pLVar6,"Reading Mesh");
  pLVar6 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[26]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [26])"  - Skeletal animations: ");
  local_1b0 = "false";
  if (mesh->hasSkeletalAnimations != false) {
    local_1b0 = "true";
  }
  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
            (local_1a8,&local_1b0);
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar6,(char *)local_1d0);
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  dest = (VertexData *)&std::__cxx11::ostringstream::VTT;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  this_00 = this->m_reader;
  if (*(int *)&this_00->end != *(int *)&this_00->current) {
    uVar2 = StreamReader<false,_false>::Get<unsigned_short>(this_00);
    uVar4 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
    this->m_currentLen = uVar4;
    this_00 = this->m_reader;
    if (*(int *)&this_00->end != *(int *)&this_00->current) {
      do {
        uVar3 = uVar2 << 4 | (uVar2 ^ 0x8000) >> 0xc;
        if ((0xf < uVar3) || ((0xf07fU >> (uVar3 & 0x1f) & 1) == 0)) {
          StreamReader<false,_false>::IncPtr(this_00,-6);
          break;
        }
        switch(uVar2 - 0x4000 >> 0xc) {
        case 0:
          dest = (VertexData *)mesh;
          ReadSubMesh(this,mesh);
          break;
        case 1:
          dest = (VertexData *)operator_new(200);
          VertexData::VertexData(dest);
          mesh->sharedVertexData = dest;
          ReadGeometry(this,dest);
          break;
        case 2:
          dest = (VertexData *)mesh;
          ReadMeshSkeletonLink(this,mesh);
          break;
        case 3:
          dest = mesh->sharedVertexData;
          ReadBoneAssignment(this,dest);
          break;
        case 4:
          dest = (VertexData *)mesh;
          ReadMeshLodInfo(this,mesh);
          break;
        case 5:
          dest = (VertexData *)0x1c;
          goto LAB_00466438;
        case 6:
          dest = (VertexData *)mesh;
          ReadSubMeshNames(this,mesh);
          break;
        case 7:
          ReadEdgeList(this,(Mesh *)dest);
          break;
        case 8:
          dest = (VertexData *)mesh;
          ReadPoses(this,mesh);
          break;
        case 9:
          dest = (VertexData *)mesh;
          ReadAnimations(this,mesh);
          break;
        case 10:
          dest = (VertexData *)((ulong)this->m_currentLen - 6);
LAB_00466438:
          StreamReader<false,_false>::IncPtr(this_00,(intptr_t)dest);
        }
        this_00 = this->m_reader;
        iVar5 = (int)this_00->end - (int)this_00->current;
        if (iVar5 != 0) {
          uVar2 = StreamReader<false,_false>::Get<unsigned_short>(this_00);
          uVar4 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
          this->m_currentLen = uVar4;
          this_00 = this->m_reader;
          iVar5 = (int)this_00->end - (int)this_00->current;
        }
      } while (iVar5 != 0);
    }
  }
  NormalizeBoneWeights((OgreBinarySerializer *)this_00,mesh->sharedVertexData);
  return;
}

Assistant:

void OgreBinarySerializer::ReadMesh(Mesh *mesh)
{
    mesh->hasSkeletalAnimations = Read<bool>();

    ASSIMP_LOG_DEBUG("Reading Mesh");
    ASSIMP_LOG_DEBUG_F( "  - Skeletal animations: ", mesh->hasSkeletalAnimations ? "true" : "false" );

    if (!AtEnd())
    {
        uint16_t id = ReadHeader();
        while (!AtEnd() &&
            (id == M_GEOMETRY ||
             id == M_SUBMESH ||
             id == M_MESH_SKELETON_LINK ||
             id == M_MESH_BONE_ASSIGNMENT ||
             id == M_MESH_LOD ||
             id == M_MESH_BOUNDS ||
             id == M_SUBMESH_NAME_TABLE ||
             id == M_EDGE_LISTS ||
             id == M_POSES ||
             id == M_ANIMATIONS ||
             id == M_TABLE_EXTREMES))
        {
            switch(id)
            {
                case M_GEOMETRY:
                {
                    mesh->sharedVertexData = new VertexData();
                    ReadGeometry(mesh->sharedVertexData);
                    break;
                }
                case M_SUBMESH:
                {
                    ReadSubMesh(mesh);
                    break;
                }
                case M_MESH_SKELETON_LINK:
                {
                    ReadMeshSkeletonLink(mesh);
                    break;
                }
                case M_MESH_BONE_ASSIGNMENT:
                {
                    ReadBoneAssignment(mesh->sharedVertexData);
                    break;
                }
                case M_MESH_LOD:
                {
                    ReadMeshLodInfo(mesh);
                    break;
                }
                case M_MESH_BOUNDS:
                {
                    ReadMeshBounds(mesh);
                    break;
                }
                case M_SUBMESH_NAME_TABLE:
                {
                    ReadSubMeshNames(mesh);
                    break;
                }
                case M_EDGE_LISTS:
                {
                    ReadEdgeList(mesh);
                    break;
                }
                case M_POSES:
                {
                    ReadPoses(mesh);
                    break;
                }
                case M_ANIMATIONS:
                {
                    ReadAnimations(mesh);
                    break;
                }
                case M_TABLE_EXTREMES:
                {
                    ReadMeshExtremes(mesh);
                    break;
                }
            }

            if (!AtEnd())
                id = ReadHeader();
        }
        if (!AtEnd())
            RollbackHeader();
    }

    NormalizeBoneWeights(mesh->sharedVertexData);
}